

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

void __thiscall pbrt::BufferCache<int>::Clear(BufferCache<int> *this)

{
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  Buffer iter;
  iterator __end0;
  iterator __begin0;
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  *__range2;
  lock_guard<std::mutex> lock;
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_28;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_20;
  lock_guard<std::mutex> *local_18;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,(mutex_type *)in_stack_ffffffffffffffa8);
  local_18 = in_RDI + 6;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::__detail::_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true>::operator*
              ((_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true> *)0x525efc);
    pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<int>
              ((polymorphic_allocator<std::byte> *)in_RDI,(int *)in_stack_ffffffffffffffa8,0x525f1a)
    ;
    std::__detail::_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true>::operator++
              ((_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true> *)in_RDI);
  }
  std::
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  ::clear((unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
           *)0x525f52);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x525f5c);
  return;
}

Assistant:

void Clear() {
        std::lock_guard<std::mutex> lock(mutex);
        for (auto iter : cache)
            alloc.deallocate_object(const_cast<T *>(iter.ptr), iter.size);
        cache.clear();
    }